

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpositer.cpp
# Opt level: O0

UBool __thiscall icu_63::FieldPositionIterator::next(FieldPositionIterator *this,FieldPosition *fp)

{
  int iVar1;
  int32_t iVar2;
  FieldPosition *fp_local;
  FieldPositionIterator *this_local;
  
  if (this->pos == -1) {
    this_local._7_1_ = '\0';
  }
  else {
    iVar1 = this->pos;
    this->pos = iVar1 + 1;
    iVar2 = UVector32::elementAti(this->data,iVar1);
    FieldPosition::setField(fp,iVar2);
    iVar1 = this->pos;
    this->pos = iVar1 + 1;
    iVar2 = UVector32::elementAti(this->data,iVar1);
    FieldPosition::setBeginIndex(fp,iVar2);
    iVar1 = this->pos;
    this->pos = iVar1 + 1;
    iVar2 = UVector32::elementAti(this->data,iVar1);
    FieldPosition::setEndIndex(fp,iVar2);
    iVar1 = this->pos;
    iVar2 = UVector32::size(this->data);
    if (iVar1 == iVar2) {
      this->pos = -1;
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool FieldPositionIterator::next(FieldPosition& fp) {
  if (pos == -1) {
    return FALSE;
  }

  fp.setField(data->elementAti(pos++));
  fp.setBeginIndex(data->elementAti(pos++));
  fp.setEndIndex(data->elementAti(pos++));

  if (pos == data->size()) {
    pos = -1;
  }

  return TRUE;
}